

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

int is_pattern_silent(IT_PATTERN *pattern,int order)

{
  IT_ENTRY *pIVar1;
  int n;
  IT_ENTRY *end;
  IT_ENTRY *entry;
  int ret;
  int order_local;
  IT_PATTERN *pattern_local;
  int local_4;
  
  ret = 1;
  if ((((pattern == (IT_PATTERN *)0x0) || (pattern->n_rows == 0)) || (pattern->n_entries == 0)) ||
     (pattern->entry == (IT_ENTRY *)0x0)) {
    local_4 = 2;
  }
  else {
    if (pattern->n_entries == pattern->n_rows) {
      entry = pattern->entry;
      n = 0;
      for (; (n < pattern->n_entries && (0x3f < entry->channel)); entry = entry + 1) {
        n = n + 1;
      }
      if (n == pattern->n_entries) {
        return 2;
      }
    }
    entry = pattern->entry;
    pIVar1 = entry + pattern->n_entries;
    for (; entry < pIVar1; entry = entry + 1) {
      if (entry->channel < 0x40) {
        if ((entry->mask & 6) != 0) {
          return 0;
        }
        if (((entry->mask & 1) != 0) && (entry->note < 0x78)) {
          return 0;
        }
        if ((entry->mask & 8) != 0) {
          switch(entry->effect) {
          case '\x01':
            if (0x40 < entry->effectvalue) {
              ret = ret + 1;
            }
            break;
          case '\x02':
            if ((uint)entry->effectvalue != order) {
              return 0;
            }
            break;
          case '\x03':
            if (((int)(uint)entry->effectvalue >> 4) * 10 + (entry->effectvalue & 0xf) != order) {
              return 0;
            }
            break;
          default:
            return 0;
          case '\f':
          case '\x0f':
          case '\x17':
            if (entry->effectvalue != '\0') {
              return 0;
            }
            break;
          case '\x13':
            switch(entry->effectvalue >> 4) {
            case '\0':
              if (entry->effectvalue != '\0') {
                return 0;
              }
              break;
            default:
              return 0;
            case '\x06':
            case '\v':
            case '\x0e':
              ret = ret + 1;
              break;
            case '\a':
              if (2 < (entry->effectvalue & 0xf)) {
                return 0;
              }
            }
            break;
          case '\x14':
          case ' ':
            break;
          case '\x16':
            if (entry->effectvalue != '\0') {
              return 0;
            }
          }
        }
      }
    }
    local_4 = ret;
  }
  return local_4;
}

Assistant:

static int is_pattern_silent(IT_PATTERN * pattern, int order) {
	int ret = 1;
	IT_ENTRY * entry, * end;
	if (!pattern || !pattern->n_rows || !pattern->n_entries || !pattern->entry) return 2;

	if ( pattern->n_entries == pattern->n_rows ) {
		int n;
		entry = pattern->entry;
		for ( n = 0; n < pattern->n_entries; ++n, ++entry ) {
			if ( !IT_IS_END_ROW(entry) ) break;
		}
		if ( n == pattern->n_entries ) return 2;
		// broken?
	}

	entry = pattern->entry;
	end = entry + pattern->n_entries;

	while (entry < end) {
		if (!IT_IS_END_ROW(entry)) {
			if (entry->mask & (IT_ENTRY_INSTRUMENT | IT_ENTRY_VOLPAN))
				return 0;
			if (entry->mask & IT_ENTRY_NOTE && entry->note < 120)
				return 0;
			if (entry->mask & IT_ENTRY_EFFECT) {
				switch (entry->effect) {
					case IT_SET_GLOBAL_VOLUME:
						if (entry->effectvalue) return 0;
						break;

					case IT_SET_SPEED:
						if (entry->effectvalue > 64) ret++;
						break;

					case IT_SET_SONG_TEMPO:
					case IT_XM_KEY_OFF:
						break;

					case IT_JUMP_TO_ORDER:
						if (entry->effectvalue != order)
							return 0;
						break;

					case IT_S:
						switch (entry->effectvalue >> 4) {
							case 0: // meh bastard
								if ( entry->effectvalue != 0 ) return 0;
								break;

							case IT_S_FINE_PATTERN_DELAY:
							case IT_S_PATTERN_LOOP:
							case IT_S_PATTERN_DELAY:
								ret++;
								break;

							case IT_S7:
								if ((entry->effectvalue & 15) > 2)
									return 0;
								break;

							default:
								return 0;
						}
						break;

					// clever idiot with his S L O W crap; do nothing
					case IT_VOLSLIDE_TONEPORTA:
					case IT_SET_SAMPLE_OFFSET:
					case IT_GLOBAL_VOLUME_SLIDE:
						if ( entry->effectvalue != 0 ) return 0;
						break;

					// genius also uses this instead of jump to order by mistake, meh, and it's bloody BCD
					case IT_BREAK_TO_ROW:						
						if ( ( ( entry->effectvalue >> 4 ) * 10 + ( entry->effectvalue & 15 ) ) != order ) return 0;
						break;

					default:
						return 0;
				}
			}
		}
		entry++;
	}

	return ret;
}